

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

Statement *
slang::ast::BlockStatement::fromSyntax
          (Compilation *comp,BlockStatementSyntax *syntax,ASTContext *sourceCtx,
          StatementContext *stmtCtx,bool addInitializers)

{
  bool bVar1;
  int iVar2;
  Diagnostic *this;
  Statement *pSVar3;
  StatementSyntax *pSVar4;
  undefined4 extraout_var;
  bitmask<slang::ast::StatementFlags> local_17c;
  Compilation *local_178;
  BlockStatement *result;
  BlockStatement *local_168;
  Statement *stmt;
  SyntaxNode *item;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::SyntaxNode> *__range2;
  undefined1 local_130 [8];
  SmallVector<const_slang::ast::Statement_*,_5UL> buffer;
  bool anyBad;
  byte local_e1;
  undefined1 auStack_e0 [7];
  bool wasInForkJoin;
  SourceRange local_d0;
  DiagCode local_bc;
  ProceduralBlockSymbol *local_b8;
  ProceduralBlockSymbol *proc;
  bitmask<slang::ast::ASTFlags> local_a8;
  bitmask<slang::ast::ASTFlags> local_a0;
  SourceRange local_98;
  DiagCode local_84;
  bitmask<slang::ast::ASTFlags> local_80;
  StatementBlockKind local_74;
  undefined1 local_70 [4];
  StatementBlockKind blockKind;
  ASTContext context;
  bool addInitializers_local;
  StatementContext *stmtCtx_local;
  ASTContext *sourceCtx_local;
  BlockStatementSyntax *syntax_local;
  Compilation *comp_local;
  
  context.assertionInstance._7_1_ = addInitializers;
  memcpy(local_70,sourceCtx,0x38);
  local_74 = SemanticFacts::getStatementBlockKind(syntax);
  local_80 = ast::operator|(Function,Final);
  bVar1 = bitmask<slang::ast::ASTFlags>::has
                    ((bitmask<slang::ast::ASTFlags> *)&context.lookupIndex,&local_80);
  if (bVar1) {
    if ((local_74 == JoinAll) || (local_74 == JoinAny)) {
      local_84.subsystem = Statements;
      local_84.code = 0x46;
      local_98 = parsing::Token::range(&syntax->end);
      ASTContext::addDiag((ASTContext *)local_70,local_84,local_98);
      pSVar3 = Statement::badStmt(comp,(Statement *)0x0);
      return pSVar3;
    }
    if (local_74 == JoinNone) {
      local_a8 = operator~(Function);
      proc = (ProceduralBlockSymbol *)operator~(Final);
      local_a0 = bitmask<slang::ast::ASTFlags>::operator&
                           (&local_a8,(bitmask<slang::ast::ASTFlags> *)&proc);
      bitmask<slang::ast::ASTFlags>::operator&=
                ((bitmask<slang::ast::ASTFlags> *)&context.lookupIndex,&local_a0);
    }
  }
  else if ((local_74 != Sequential) &&
          (bVar1 = ASTContext::inAlwaysCombLatch((ASTContext *)local_70), bVar1)) {
    local_b8 = ASTContext::getProceduralBlock((ASTContext *)local_70);
    if (local_b8 != (ProceduralBlockSymbol *)0x0) {
      local_bc.subsystem = Statements;
      local_bc.code = 0x17;
      local_d0 = parsing::Token::range(&syntax->begin);
      this = ASTContext::addDiag((ASTContext *)local_70,local_bc,local_d0);
      _auStack_e0 = SemanticFacts::getProcedureKindStr(local_b8->procedureKind);
      Diagnostic::operator<<(this,_auStack_e0);
      pSVar3 = Statement::badStmt(comp,(Statement *)0x0);
      return pSVar3;
    }
    assert::assertFailed
              ("proc",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Statements.cpp"
               ,0x29d,
               "static Statement &slang::ast::BlockStatement::fromSyntax(Compilation &, const BlockStatementSyntax &, const ASTContext &, StatementContext &, bool)"
              );
  }
  bitmask<slang::ast::StatementFlags>::bitmask
            ((bitmask<slang::ast::StatementFlags> *)&stack0xffffffffffffff18,InForkJoin);
  local_e1 = bitmask<slang::ast::StatementFlags>::has
                       (&stmtCtx->flags,
                        (bitmask<slang::ast::StatementFlags> *)&stack0xffffffffffffff18);
  if (local_74 != Sequential) {
    bitmask<slang::ast::StatementFlags>::bitmask
              ((bitmask<slang::ast::StatementFlags> *)(buffer.stackBase + 0x1c),InForkJoin);
    bitmask<slang::ast::StatementFlags>::operator|=
              (&stmtCtx->flags,(bitmask<slang::ast::StatementFlags> *)(buffer.stackBase + 0x1c));
  }
  buffer.stackBase[0x1b] = '\0';
  SmallVector<const_slang::ast::Statement_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Statement_*,_5UL> *)local_130);
  if ((context.assertionInstance._7_1_ & 1) != 0) {
    Statement::bindScopeInitializers
              ((ASTContext *)local_70,(SmallVectorBase<const_slang::ast::Statement_*> *)local_130);
  }
  __begin2 = (iterator)&syntax->items;
  __end2 = nonstd::span_lite::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>::begin
                     (&(syntax->items).
                       super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>);
  item = (SyntaxNode *)
         nonstd::span_lite::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>::end
                   ((span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> *)(__begin2 + 4));
  for (; (SyntaxNode *)__end2 != item; __end2 = __end2 + 1) {
    stmt = (Statement *)*__end2;
    bVar1 = slang::syntax::StatementSyntax::isKind(*(SyntaxKind *)&stmt->syntax);
    if (bVar1) {
      pSVar4 = slang::syntax::SyntaxNode::as<slang::syntax::StatementSyntax>((SyntaxNode *)stmt);
      iVar2 = Statement::bind((int)pSVar4,(sockaddr *)local_70,(socklen_t)stmtCtx);
      result = (BlockStatement *)CONCAT44(extraout_var,iVar2);
      local_168 = result;
      SmallVectorBase<const_slang::ast::Statement_*>::push_back
                ((SmallVectorBase<const_slang::ast::Statement_*> *)local_130,(Statement **)&result);
      bVar1 = Statement::bad(&local_168->super_Statement);
      buffer.stackBase[0x1b] = (buffer.stackBase[0x1b] & 1U) != 0 || bVar1;
    }
  }
  local_178 = (Compilation *)
              createBlockStatement
                        (comp,(SmallVectorBase<const_slang::ast::Statement_*> *)local_130,
                         (SyntaxNode *)syntax,local_74);
  if ((local_74 != Sequential) && ((local_e1 & 1) == 0)) {
    local_17c = operator~(InForkJoin);
    bitmask<slang::ast::StatementFlags>::operator&=(&stmtCtx->flags,&local_17c);
  }
  if ((buffer.stackBase[0x1b] & 1U) == 0) {
    comp_local = local_178;
  }
  else {
    comp_local = (Compilation *)Statement::badStmt(comp,(Statement *)local_178);
  }
  SmallVector<const_slang::ast::Statement_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Statement_*,_5UL> *)local_130);
  return (Statement *)comp_local;
}

Assistant:

Statement& BlockStatement::fromSyntax(Compilation& comp, const BlockStatementSyntax& syntax,
                                      const ASTContext& sourceCtx, StatementContext& stmtCtx,
                                      bool addInitializers) {
    ASTContext context = sourceCtx;
    auto blockKind = SemanticFacts::getStatementBlockKind(syntax);
    if (context.flags.has(ASTFlags::Function | ASTFlags::Final)) {
        if (blockKind == StatementBlockKind::JoinAll || blockKind == StatementBlockKind::JoinAny) {
            context.addDiag(diag::TimingInFuncNotAllowed, syntax.end.range());
            return badStmt(comp, nullptr);
        }
        else if (blockKind == StatementBlockKind::JoinNone) {
            // The "function body" flag does not propagate through fork-join_none
            // blocks, as all statements are allowed in those.
            context.flags &= ~ASTFlags::Function & ~ASTFlags::Final;
        }
    }
    else if (blockKind != StatementBlockKind::Sequential && context.inAlwaysCombLatch()) {
        auto proc = context.getProceduralBlock();
        ASSERT(proc);
        context.addDiag(diag::ForkJoinAlwaysComb, syntax.begin.range())
            << SemanticFacts::getProcedureKindStr(proc->procedureKind);
        return badStmt(comp, nullptr);
    }

    bool wasInForkJoin = stmtCtx.flags.has(StatementFlags::InForkJoin);
    if (blockKind != StatementBlockKind::Sequential)
        stmtCtx.flags |= StatementFlags::InForkJoin;

    bool anyBad = false;
    SmallVector<const Statement*> buffer;

    if (addInitializers)
        bindScopeInitializers(context, buffer);

    for (auto item : syntax.items) {
        if (StatementSyntax::isKind(item->kind)) {
            auto& stmt = Statement::bind(item->as<StatementSyntax>(), context, stmtCtx,
                                         /* inList */ true);
            buffer.push_back(&stmt);
            anyBad |= stmt.bad();
        }
    }

    auto result = createBlockStatement(comp, buffer, syntax, blockKind);

    if (blockKind != StatementBlockKind::Sequential && !wasInForkJoin)
        stmtCtx.flags &= ~StatementFlags::InForkJoin;

    if (anyBad)
        return badStmt(comp, result);

    return *result;
}